

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

ProString * __thiscall ProString::append(ProString *this,ProString *other,bool *pending)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  int iVar3;
  undefined4 uVar4;
  CutResult CVar5;
  int iVar6;
  size_t sVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1Char,_QStringView> local_48;
  char16_t *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (other->m_length == 0) goto LAB_002a2c0d;
  if ((long)this->m_length == 0) {
    QString::operator=(&this->m_string,(QString *)other);
    iVar6 = other->m_length;
    iVar3 = other->m_file;
    uVar4 = *(undefined4 *)&other->field_0x24;
    this->m_offset = other->m_offset;
    this->m_length = iVar6;
    this->m_file = iVar3;
    *(undefined4 *)&this->field_0x24 = uVar4;
    sVar7 = other->m_hash;
  }
  else {
    if ((this->m_string).d.size != (long)this->m_length) {
      QString::mid((longlong)&local_48,(longlong)this);
      pQVar1 = &((this->m_string).d.d)->super_QArrayData;
      pcVar8 = (this->m_string).d.ptr;
      (this->m_string).d.d = (Data *)local_48._0_8_;
      (this->m_string).d.ptr = (char16_t *)local_48.b.m_size;
      pcVar2 = (char16_t *)(this->m_string).d.size;
      (this->m_string).d.size = (qsizetype)local_48.b.m_data;
      local_48.b.m_size = (qsizetype)pcVar8;
      local_48.b.m_data = pcVar2;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_48._0_8_ = pQVar1;
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    if (pending == (bool *)0x0) {
      iVar6 = other->m_length;
LAB_002a2b87:
      pcVar8 = (other->m_string).d.ptr;
      local_48._0_8_ = SEXT48(other->m_offset);
      local_30 = (char16_t *)(long)iVar6;
      CVar5 = QtPrivate::QContainerImplHelper::mid
                        ((other->m_string).d.size,(qsizetype *)&local_48,(qsizetype *)&local_30);
      if (CVar5 == Null) {
        pcVar8 = (char16_t *)0x0;
      }
      else {
        pcVar8 = pcVar8 + local_48._0_8_;
      }
      QString::append((QChar *)this,(longlong)pcVar8);
    }
    else {
      iVar6 = other->m_length;
      if (*pending != false) goto LAB_002a2b87;
      local_30 = (char16_t *)(long)iVar6;
      pcVar8 = (other->m_string).d.ptr;
      local_48._0_8_ = SEXT48(other->m_offset);
      CVar5 = QtPrivate::QContainerImplHelper::mid
                        ((other->m_string).d.size,(qsizetype *)&local_48,(qsizetype *)&local_30);
      if (CVar5 == Null) {
        local_48.b.m_size = 0;
        local_48.b.m_data = (char16_t *)0x0;
      }
      else {
        local_48.b.m_data = pcVar8 + local_48._0_8_;
        local_48.b.m_size = (qsizetype)local_30;
      }
      local_48.a.ch = 0x20;
      ::operator+=(&this->m_string,&local_48);
    }
    this->m_length = (int)(this->m_string).d.size;
    this->m_offset = 0;
    if (other->m_file != 0) {
      this->m_file = other->m_file;
    }
    sVar7 = 0x80000000;
  }
  this->m_hash = sVar7;
  if (pending != (bool *)0x0) {
    *pending = true;
  }
LAB_002a2c0d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProString &ProString::append(const ProString &other, bool *pending)
{
    if (other.m_length) {
        if (!m_length) {
            *this = other;
        } else {
            if (m_length != m_string.size())
                m_string = toQString();
            if (pending && !*pending) {
                m_string += QLatin1Char(' ') + other.toQStringView();
            } else {
                m_string += other.toQStringView();
            }
            m_length = m_string.size();
            m_offset = 0;
            if (other.m_file)
                m_file = other.m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}